

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O1

bool __thiscall
ON_Extrusion::Evaluate
          (ON_Extrusion *this,double u,double v,int num_der,int array_stride,double *der_array,
          int quadrant,int *hint)

{
  ON_Line *this_00;
  ON_Curve *pOVar1;
  double dVar2;
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dVector T_00;
  ON_3dVector T_01;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  ulong sz;
  ON_Xform *pOVar10;
  ON_Xform *pOVar11;
  ON_3dVector *pOVar12;
  int iVar13;
  double *pdVar14;
  bool bVar15;
  byte bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  ON_3dVector T;
  ON_Xform xform0;
  ON_Xform xform1;
  double *local_200;
  double local_1f8;
  double *local_1d8;
  ON_Xform *local_1b8;
  ON_3dVector local_178;
  ON_Xform local_160;
  ON_Xform local_e0;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  bVar16 = 0;
  pOVar1 = this->m_profile;
  if (pOVar1 != (ON_Curve *)0x0) {
    dVar17 = u;
    local_1f8 = v;
    if (this->m_bTransposed == true) {
      dVar17 = v;
      local_1f8 = u;
      if (quadrant == 4) {
        quadrant = 2;
      }
      else if (quadrant == 2) {
        quadrant = 4;
      }
    }
    uVar3 = 1;
    if ((quadrant != 1) && (quadrant != 4)) {
      uVar3 = -(uint)((quadrant & 0xfffffffeU) == 2);
    }
    iVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3b])
                      (SUB84(dVar17,0),pOVar1,(ulong)(uint)num_der,(ulong)(uint)array_stride,
                       der_array,(ulong)uVar3);
    if ((char)iVar4 != '\0') {
      dVar17 = ON_Interval::NormalizedParameterAt(&this->m_path_domain,local_1f8);
      dVar18 = 1.0 - dVar17;
      local_1b8 = &local_160;
      ON_Xform::ON_Xform(local_1b8);
      ON_Xform::ON_Xform(&local_e0);
      this_00 = &this->m_path;
      ON_Line::Tangent(&local_178,this_00);
      if (((0 < num_der) || (dVar18 != 0.0)) || (NAN(dVar18))) {
        ON_Line::PointAt(&local_48,this_00,(this->m_t).m_t[0]);
        pOVar12 = this->m_N;
        if (this->m_bHaveN[0] == false) {
          pOVar12 = (ON_3dVector *)0x0;
        }
        P.y = local_48.y;
        P.x = local_48.x;
        P.z = local_48.z;
        T_00.y = local_178.y;
        T_00.x = local_178.x;
        T_00.z = local_178.z;
        bVar15 = ON_GetEndCapTransformation
                           (P,T_00,this->m_up,pOVar12,&local_160,(ON_Xform *)0x0,(ON_Xform *)0x0);
        if (!bVar15) {
          return false;
        }
      }
      else {
        pOVar10 = &ON_Xform::Zero4x4;
        pOVar11 = &local_160;
        for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
          pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
          pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar16 * -2 + 1) * 8);
          pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar16 * -2 + 1) * 8);
        }
      }
      if (((0 < num_der) || (dVar17 != 0.0)) || (NAN(dVar17))) {
        ON_Line::PointAt(&local_60,this_00,(this->m_t).m_t[1]);
        pOVar12 = this->m_N + 1;
        if (this->m_bHaveN[1] == false) {
          pOVar12 = (ON_3dVector *)0x0;
        }
        P_00.y = local_60.y;
        P_00.x = local_60.x;
        P_00.z = local_60.z;
        T_01.y = local_178.y;
        T_01.x = local_178.x;
        T_01.z = local_178.z;
        bVar15 = ON_GetEndCapTransformation
                           (P_00,T_01,this->m_up,pOVar12,&local_e0,(ON_Xform *)0x0,(ON_Xform *)0x0);
        if (!bVar15) {
          return false;
        }
      }
      else {
        pOVar10 = &ON_Xform::Zero4x4;
        pOVar11 = &local_e0;
        for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
          pOVar11->m_xform[0][0] = pOVar10->m_xform[0][0];
          pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar16 * -2 + 1) * 8);
          pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar16 * -2 + 1) * 8);
        }
      }
      dVar2 = dVar18 * local_160.m_xform[0][0] + dVar17 * local_e0.m_xform[0][0];
      dVar19 = dVar18 * local_160.m_xform[0][1] + dVar17 * local_e0.m_xform[0][1];
      dVar22 = dVar18 * local_160.m_xform[1][0] + dVar17 * local_e0.m_xform[1][0];
      dVar23 = dVar18 * local_160.m_xform[1][1] + dVar17 * local_e0.m_xform[1][1];
      dVar28 = dVar18 * local_160.m_xform[2][0] + dVar17 * local_e0.m_xform[2][0];
      dVar29 = dVar18 * local_160.m_xform[2][1] + dVar17 * local_e0.m_xform[2][1];
      pdVar5 = der_array + ((int)((num_der + 2) * (num_der + 1U)) / 2 + -1) * array_stride;
      lVar6 = (long)(array_stride * num_der);
      dVar30 = der_array[lVar6];
      dVar21 = der_array[lVar6 + 1];
      if (0 < num_der) {
        dVar31 = (this->m_path_domain).m_t[1] - (this->m_path_domain).m_t[0];
        dVar20 = (double)(~-(ulong)(0.0 < dVar31) & (ulong)dVar31 |
                         (ulong)(1.0 / dVar31) & -(ulong)(0.0 < dVar31));
        pdVar7 = der_array + lVar6;
        dVar31 = (local_e0.m_xform[1][0] - local_160.m_xform[1][0]) * dVar20;
        dVar24 = (local_e0.m_xform[1][1] - local_160.m_xform[1][1]) * dVar20;
        dVar25 = (local_e0.m_xform[2][0] - local_160.m_xform[2][0]) * dVar20;
        dVar33 = (local_e0.m_xform[2][1] - local_160.m_xform[2][1]) * dVar20;
        lVar6 = (long)array_stride;
        dVar26 = dVar21;
        dVar27 = dVar30;
        iVar4 = num_der;
        do {
          dVar30 = pdVar7[-lVar6];
          dVar21 = pdVar7[1 - lVar6];
          if (iVar4 != 1) {
            iVar13 = 1;
            do {
              *pdVar5 = 0.0;
              pdVar5[1] = 0.0;
              pdVar5[2] = 0.0;
              iVar13 = iVar13 + 1;
              pdVar5 = pdVar5 + -lVar6;
            } while (iVar4 != iVar13);
          }
          dVar32 = (local_e0.m_xform[0][0] - local_160.m_xform[0][0]) * dVar20 * dVar30 +
                   (local_e0.m_xform[0][1] - local_160.m_xform[0][1]) * dVar20 * dVar21;
          if (iVar4 == 1) {
            *pdVar5 = dVar32 + (local_e0.m_xform[0][3] - local_160.m_xform[0][3]) * dVar20;
            pdVar5[1] = dVar31 * dVar30 + dVar24 * dVar21 +
                        (local_e0.m_xform[1][3] - local_160.m_xform[1][3]) * dVar20;
            dVar32 = dVar25 * dVar30 + dVar33 * dVar21 +
                     (local_e0.m_xform[2][3] - local_160.m_xform[2][3]) * dVar20;
          }
          else {
            *pdVar5 = dVar32;
            pdVar5[1] = dVar31 * dVar30 + dVar24 * dVar21;
            dVar32 = dVar25 * dVar30 + dVar33 * dVar21;
          }
          pdVar7 = pdVar7 + -lVar6;
          pdVar5[2] = dVar32;
          pdVar5 = pdVar5 + -lVar6;
          *pdVar5 = dVar2 * dVar27 + dVar19 * dVar26;
          pdVar5[1] = dVar22 * dVar27 + dVar23 * dVar26;
          pdVar5[2] = dVar27 * dVar28 + dVar26 * dVar29;
          pdVar5 = pdVar5 + -lVar6;
          bVar15 = 1 < iVar4;
          dVar26 = dVar21;
          dVar27 = dVar30;
          iVar4 = iVar4 + -1;
        } while (bVar15);
      }
      *pdVar5 = dVar18 * local_160.m_xform[0][3] + dVar17 * local_e0.m_xform[0][3] +
                dVar2 * dVar30 + dVar19 * dVar21;
      pdVar5[1] = dVar18 * local_160.m_xform[1][3] + dVar17 * local_e0.m_xform[1][3] +
                  dVar22 * dVar30 + dVar23 * dVar21;
      pdVar5[2] = dVar18 * local_160.m_xform[2][3] + dVar17 * local_e0.m_xform[2][3] +
                  dVar28 * dVar30 + dVar29 * dVar21;
      if (num_der < 1) {
        return true;
      }
      if (this->m_bTransposed == false) {
        return true;
      }
      iVar4 = 3;
      if (array_stride < 3) {
        iVar4 = array_stride;
      }
      sz = (long)iVar4 << 3;
      if (0x80 < sz) {
        local_1b8 = (ON_Xform *)onmalloc(sz);
      }
      if (0 < num_der) {
        lVar6 = (long)array_stride;
        local_1d8 = der_array + lVar6;
        uVar8 = 1;
        local_200 = der_array;
        do {
          uVar9 = uVar8 + 1;
          if (0 < (long)(uVar8 * lVar6)) {
            iVar4 = ((int)uVar9 * (int)uVar8 * array_stride) / 2;
            pdVar5 = der_array + iVar4;
            pdVar7 = local_1d8 + iVar4;
            pdVar14 = local_200 + iVar4;
            do {
              memcpy(local_1b8,pdVar5,sz);
              memcpy(pdVar5,pdVar7,sz);
              memcpy(pdVar7,local_1b8,sz);
              pdVar5 = pdVar5 + lVar6;
              pdVar7 = pdVar7 + -lVar6;
              bVar15 = pdVar5 < pdVar14;
              pdVar14 = pdVar14 + -lVar6;
            } while (bVar15);
          }
          local_200 = local_200 + lVar6;
          local_1d8 = local_1d8 + lVar6;
          uVar8 = uVar9;
        } while (uVar9 != num_der + 1U);
      }
      if (local_1b8 != &local_160) {
        onfree(local_1b8);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Extrusion::Evaluate( // returns false if unable to evaluate
       double u, double v,   // evaluation parameters
       int num_der,          // number of derivatives (>=0)
       int array_stride,     // array stride (>=Dimension())
       double* der_array,    // array of length stride*(ndir+1)*(ndir+2)/2
       int quadrant ,     // optional - determines which quadrant to evaluate from
                             //         0 = default
                             //         1 from NE quadrant
                             //         2 from NW quadrant
                             //         3 from SW quadrant
                             //         4 from SE quadrant
       int* hint          // optional - evaluation hint (int[2]) used to speed
                             //            repeated evaluations
       ) const 
{
  if ( !m_profile )
    return false;

  double x,y,dx,dy;
  //int side = 0;
  if ( m_bTransposed ) 
  {
    x = u; u = v; v = x;
    if ( 4 == quadrant )
      quadrant = 2;
    else if ( 2 == quadrant )
      quadrant = 4;
  }

  if ( !m_profile->Evaluate( u, num_der, array_stride, der_array,
                             (1==quadrant||4==quadrant)?1:((2==quadrant||3==quadrant)?-1:0),
                               hint) 
     )
  {
    return false;
  }

  // TODO: After testing, add special case that avoids
  //       two calls to GetProfileTransformation() when 
  //       mitering is trivial.
  const double t1 = m_path_domain.NormalizedParameterAt(v);
  const double t0 = 1.0-t1;
  ON_Xform xform0, xform1;
  const ON_3dVector T = m_path.Tangent();

  if ( 0.0 != t0 || num_der > 0 )
  {
    if ( !ON_GetEndCapTransformation(m_path.PointAt(m_t.m_t[0]),T,m_up,m_bHaveN[0]?&m_N[0]:0,xform0,0,0) )
      return false;
  }
  else
  {
    xform0 = ON_Xform::Zero4x4;
  }

  if ( 0.0 != t1 || num_der > 0 )
  {
    if ( !ON_GetEndCapTransformation(m_path.PointAt(m_t.m_t[1]),T,m_up,m_bHaveN[1]?&m_N[1]:0,xform1,0,0) )
      return false;
  }
  else
  {
    xform1 = ON_Xform::Zero4x4;
  }

  double xformP[3][3], xformD[3][3];
  xformP[0][0] = t0*xform0.m_xform[0][0] + t1*xform1.m_xform[0][0];
  xformP[0][1] = t0*xform0.m_xform[0][1] + t1*xform1.m_xform[0][1];
  xformP[0][2] = t0*xform0.m_xform[0][3] + t1*xform1.m_xform[0][3];
  xformP[1][0] = t0*xform0.m_xform[1][0] + t1*xform1.m_xform[1][0];
  xformP[1][1] = t0*xform0.m_xform[1][1] + t1*xform1.m_xform[1][1];
  xformP[1][2] = t0*xform0.m_xform[1][3] + t1*xform1.m_xform[1][3];
  xformP[2][0] = t0*xform0.m_xform[2][0] + t1*xform1.m_xform[2][0];
  xformP[2][1] = t0*xform0.m_xform[2][1] + t1*xform1.m_xform[2][1];
  xformP[2][2] = t0*xform0.m_xform[2][3] + t1*xform1.m_xform[2][3];

  int i,j;
  i = num_der+1;
  double* d1 = der_array + array_stride*(i*(i+1)/2 - 1);
  double* d0 = der_array + array_stride*(i - 1);
  x = d0[0];
  y = d0[1];
  if ( num_der > 0 )
  {
    double d = m_path_domain.m_t[1] - m_path_domain.m_t[0];
    if ( d > 0.0 )
      d = 1.0/d;
    xformD[0][0] = d*(xform1.m_xform[0][0] - xform0.m_xform[0][0]);
    xformD[0][1] = d*(xform1.m_xform[0][1] - xform0.m_xform[0][1]);
    xformD[0][2] = d*(xform1.m_xform[0][3] - xform0.m_xform[0][3]);
    xformD[1][0] = d*(xform1.m_xform[1][0] - xform0.m_xform[1][0]);
    xformD[1][1] = d*(xform1.m_xform[1][1] - xform0.m_xform[1][1]);
    xformD[1][2] = d*(xform1.m_xform[1][3] - xform0.m_xform[1][3]);
    xformD[2][0] = d*(xform1.m_xform[2][0] - xform0.m_xform[2][0]);
    xformD[2][1] = d*(xform1.m_xform[2][1] - xform0.m_xform[2][1]);
    xformD[2][2] = d*(xform1.m_xform[2][3] - xform0.m_xform[2][3]);

    for ( i = num_der; i > 0; i-- )
    {
      dx = x;
      dy = y;
      d0 -= array_stride;
      x = d0[0];
      y = d0[1];

      // all partials involving two or more derivatives with
      // respect to "v" are zero.
      j = i;
      while ( --j )
      {
        d1[0] = d1[1] = d1[2] = 0.0;
        d1 -= array_stride;
      }    

      // The partial involving a single derivative with respect to "v"
      if ( 1 == i )
      {
        // xformD transform is applied to curve location ((x,y) = point)
        d1[0] = xformD[0][0]*x + xformD[0][1]*y + xformD[0][2];
        d1[1] = xformD[1][0]*x + xformD[1][1]*y + xformD[1][2];
        d1[2] = xformD[2][0]*x + xformD[2][1]*y + xformD[2][2];
      }
      else
      {
        // xformD transform is applied to a curve derivative ((x,y) = vector)
        d1[0] = xformD[0][0]*x + xformD[0][1]*y;
        d1[1] = xformD[1][0]*x + xformD[1][1]*y;
        d1[2] = xformD[2][0]*x + xformD[2][1]*y;
      }
      d1 -= array_stride;

      // The partial involving a all derivatives with respect to "u"
      // xformP transformation is applied to a curve derivative ((x,y) = vector)
      d1[0] = xformP[0][0]*dx + xformP[0][1]*dy;
      d1[1] = xformP[1][0]*dx + xformP[1][1]*dy;
      d1[2] = xformP[2][0]*dx + xformP[2][1]*dy;
      d1 -= array_stride;
    }
  }
  // xformP transformation is applied curve location ((x,y) = point)
  d1[0] = xformP[0][0]*x + xformP[0][1]*y + xformP[0][2];
  d1[1] = xformP[1][0]*x + xformP[1][1]*y + xformP[1][2];
  d1[2] = xformP[2][0]*x + xformP[2][1]*y + xformP[2][2];

  if ( m_bTransposed && num_der > 0)
  {
    // reverse order of derivatives
    const size_t sz = ((3 <= array_stride)?3:array_stride)*sizeof(double);
    void* tmp = ( sz <= sizeof(xform0) )
              ? ((void*)&xform0.m_xform[0][0])
              : onmalloc(sz);
    for ( i = 1; i <= num_der; i++ )
    {
      d0 = der_array + array_stride*(i*(i+1))/2;
      d1 = d0 + array_stride*i;
      while ( d0 < d1)
      {
        memcpy(tmp,d0,sz);
        memcpy(d0,d1,sz);
        memcpy(d1,tmp,sz);
        d0 += array_stride;
        d1 -= array_stride;
      }
    }
    if ( tmp != ((void*)&xform0.m_xform[0][0]) )
      onfree(tmp);
  }

  return true;
}